

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          void **vtt,TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  long *in_RSI;
  long *in_RDI;
  int i;
  TPZGeoEl *in_stack_000001e8;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_000001f0;
  TPZGeoElSideIndex *in_stack_ffffffffffffff60;
  TPZGeoMesh *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  TPZVec<long> *in_stack_ffffffffffffff78;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *in_stack_ffffffffffffff80;
  long *local_70;
  TPZGeoElSideIndex local_50;
  int local_38;
  
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->_vptr_TPZVec,
                     in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[3];
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_70 = in_RDI + 0x15d;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff60);
    local_70 = local_70 + 3;
  } while (local_70 != in_RDI + 0x178);
  for (local_38 = 0; local_38 < 9; local_38 = local_38 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff60);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_38 * 3 + 0x15d),&local_50);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x17beed3);
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::Initialize(in_stack_000001f0,in_stack_000001e8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}